

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

int __thiscall pbrt::Disk::writeTo(Disk *this,BinaryWriter *binary)

{
  Shape::writeTo(&this->super_Shape,binary);
  BinaryWriter::writeRaw(binary,&this->radius,4);
  BinaryWriter::writeRaw(binary,&this->height,4);
  BinaryWriter::writeRaw(binary,&this->transform,0x30);
  return 0x35;
}

Assistant:

int Disk::writeTo(BinaryWriter &binary) 
  {
    Shape::writeTo(binary);
    binary.write(radius);
    binary.write(height);
    binary.write(transform);
    return TYPE_DISK;
  }